

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::write_websocket(coro_http_client *this,string_view data,opcode op)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<cinatra::resp_data,_false> in_RDI;
  undefined1 in_R8B;
  resp_data *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  LazyPromise<cinatra::resp_data> *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  int iVar3;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  allocator<char> local_c9 [80];
  opcode in_stack_ffffffffffffff87;
  string *in_stack_ffffffffffffff88;
  coro_http_client *in_stack_ffffffffffffff90;
  
  puVar2 = (undefined8 *)operator_new(0x100,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = write_websocket;
    puVar2[1] = write_websocket;
    puVar2[0x1e] = in_RSI;
    puVar2[0x18] = in_RDX;
    puVar2[0x19] = in_RCX;
    *(undefined1 *)((long)puVar2 + 0xfd) = in_R8B;
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
              (in_stack_fffffffffffffdd8);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xfe));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xfe));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      std::allocator<char>::~allocator(local_c9);
      write_websocket(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff87)
      ;
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (Lazy<cinatra::resp_data> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      bVar1 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                        ((LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x1c));
      if (bVar1) {
        puVar2[0x1a] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x1c);
        async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
                  ((LazyAwaiterBase<cinatra::resp_data> *)
                   CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
        return_value<cinatra::resp_data>
                  ((LazyPromise<cinatra::resp_data> *)
                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                   in_stack_fffffffffffffdb8);
        iVar3 = 0;
        async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x436d61);
        async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x436d6e);
        if (iVar3 == 0) {
          iVar3 = 3;
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
        if (iVar3 == 3) {
          async_simple::coro::detail::LazyPromiseBase::final_suspend
                    ((LazyPromiseBase *)(puVar2 + 2));
          bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                            ((FinalAwaiter *)((long)puVar2 + 0xff));
          if (!bVar1) {
            *puVar2 = 0;
            *(undefined1 *)((long)puVar2 + 0xfc) = 2;
            write_websocket((void *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                            (void *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
          }
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xff));
        }
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
                  ((LazyPromise<cinatra::resp_data> *)0x436f31);
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0x100);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0xfc) = 1;
        write_websocket((void *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                        in_stack_fffffffffffffdd8);
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0xfc) = 0;
      write_websocket((void *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                      (void *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    }
  }
  return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> write_websocket(
      std::string_view data, opcode op = opcode::text) {
    std::string str(data);
    co_return co_await write_websocket(str, op);
  }